

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall
midi_container::serialize_as_stream
          (midi_container *this,unsigned_long subsong,
          vector<midi_stream_event,_std::allocator<midi_stream_event>_> *p_stream,
          system_exclusive_table *p_system_exclusive,unsigned_long *loop_start,
          unsigned_long *loop_end,uint clean_flags)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pmVar4;
  ulong uVar5;
  pointer pvVar6;
  pointer pcVar7;
  size_type sVar8;
  int iVar9;
  size_type __new_size;
  pointer *ppmVar10;
  unsigned_long uVar11;
  ulong uVar12;
  uint uVar13;
  size_type sVar14;
  ulong uVar15;
  unsigned_long p_subsong;
  pointer pbVar16;
  undefined8 *puVar17;
  byte bVar18;
  int iVar19;
  pointer puVar20;
  ulong uVar21;
  event_type eVar22;
  uint uVar23;
  midi_event *this_00;
  long lVar24;
  size_type sVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  midi_stream_event local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> port_numbers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  device_names;
  ulong local_b0;
  ulong local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> track_positions;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  device_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  device_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  device_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = ((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar11 = 0;
  if (this->m_form == 2) {
    uVar11 = subsong;
  }
  uVar2 = (this->m_timestamp_loop_start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11];
  uVar3 = (this->m_timestamp_loop_end).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11];
  local_f8.m_timestamp = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&track_positions,__new_size,&local_f8.m_timestamp);
  local_f8.m_timestamp = local_f8.m_timestamp & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&port_numbers,__new_size,(value_type *)&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&device_names,__new_size);
  if ((clean_flags & 1) != 0) {
    pmVar4 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar13 = 0; uVar12 = (ulong)uVar13, uVar12 < __new_size; uVar13 = uVar13 + 1) {
      lVar24 = *(long *)&pmVar4[uVar12].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      uVar21 = (long)*(pointer *)
                      ((long)&pmVar4[uVar12].m_events.
                              super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl +
                      8) - lVar24 >> 6;
      for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 1) {
        lVar28 = (ulong)uVar23 * 0x40;
        if ((((*(int *)(lVar24 + 8 + lVar28) == 3) && (*(char *)(lVar24 + 0x18 + lVar28) == 'n')) &&
            (bVar18 = *(byte *)(lVar28 + lVar24 + 0x19), 1 < bVar18)) && (bVar18 != 0x7f)) {
          track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = uVar21;
          break;
        }
      }
    }
  }
  if (this->m_form == 2) {
    ppmVar10 = (pointer *)
               ((long)&(((this->m_tracks).
                         super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_events).
                       super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8);
    for (sVar14 = 0; __new_size != sVar14; sVar14 = sVar14 + 1) {
      if (subsong != sVar14) {
        track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar14] =
             (long)*ppmVar10 - (long)((_Vector_impl_data *)(ppmVar10 + -1))->_M_start >> 6;
      }
      ppmVar10 = ppmVar10 + 3;
    }
  }
  local_a8 = 0xffffffffffffffff;
  local_b0 = 0xffffffffffffffff;
  do {
    uVar27 = 0xffffffffffffffff;
    pmVar4 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar21 = 0;
    uVar12 = uVar27;
    for (uVar13 = 0; uVar15 = (ulong)uVar13, uVar15 < __new_size; uVar13 = uVar13 + 1) {
      lVar24 = *(long *)&pmVar4[uVar15].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      if ((track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start[uVar15] <
           (ulong)((long)*(pointer *)
                          ((long)&pmVar4[uVar15].m_events.
                                  super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                  _M_impl + 8) - lVar24 >> 6)) &&
         (uVar5 = *(ulong *)(lVar24 + track_positions.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar15] * 0x40),
         uVar5 < uVar12)) {
        uVar12 = uVar5;
        uVar21 = uVar15;
      }
    }
    if (uVar12 == 0xffffffffffffffff) {
      *loop_start = local_b0;
      *loop_end = local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&device_names);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
      ;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    if ((clean_flags & 6) == 0) {
      uVar11 = track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      lVar24 = *(long *)&pmVar4[uVar21].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
LAB_001046cc:
      p_subsong = 0;
      if (this->m_form == 2) {
        p_subsong = subsong;
      }
      uVar12 = *(ulong *)(lVar24 + uVar11 * 0x40);
      if ((local_b0 == 0xffffffffffffffff) && (local_b0 = uVar27, uVar2 <= uVar12)) {
        local_b0 = *(long *)(p_stream + 8) - *(long *)p_stream >> 4;
      }
      if ((local_a8 == 0xffffffffffffffff) && (local_a8 = uVar27, uVar3 < uVar12)) {
        local_a8 = *(long *)(p_stream + 8) - *(long *)p_stream >> 4;
      }
      this_00 = (midi_event *)(lVar24 + uVar11 * 0x40);
      uVar11 = timestamp_to_ms(this,uVar12,p_subsong);
      eVar22 = this_00->m_type;
      if (eVar22 == extended) {
        puVar20 = (this_00->m_ext_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                  (this_00->m_data_count -
                  (long)(this_00->m_ext_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        bVar18 = this_00->m_data[0];
        if (bVar18 == 0xf0 && (pointer)0x2 < puVar20) {
          if (device_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length != 0) {
            pbVar16 = device_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar21;
            pvVar6 = (this->m_device_names).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar17 = *(undefined8 **)
                       &pvVar6[this_00->m_channel].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
            lVar24 = (long)*(pointer *)
                            ((long)&pvVar6[this_00->m_channel].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) - (long)puVar17 >> 5;
            lVar28 = 0;
            while ((lVar26 = lVar24, lVar24 != lVar28 &&
                   (iVar9 = strcmp((char *)*puVar17,(pbVar16->_M_dataplus)._M_p), lVar26 = lVar28,
                   iVar9 != 0))) {
              lVar28 = lVar28 + 1;
              puVar17 = puVar17 + 4;
            }
            port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21] = (uchar)lVar26;
            device_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length = 0;
            *device_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p = '\0';
            limit_port_number<unsigned_char>
                      (this,port_numbers.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar21);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&data,(size_type)puVar20);
          midi_event::copy_data
                    (this_00,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,0,(unsigned_long)puVar20);
          if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[(long)(puVar20 + -1)] == 0xf7) {
            local_f8.m_event =
                 system_exclusive_table::add_entry
                           (p_system_exclusive,
                            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,(size_t)puVar20,
                            (ulong)port_numbers.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar21]);
            local_f8.m_event = local_f8.m_event | 0x80000000;
            local_f8.m_timestamp = uVar11;
            std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
            emplace_back<midi_stream_event>(p_stream,&local_f8);
          }
        }
        else if (bVar18 == 0xff && (pointer)0x2 < puVar20) {
          uVar1 = this_00->m_data[1];
          if (uVar1 == '\x04') {
LAB_001048be:
            puVar20 = puVar20 + -2;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&data,(size_type)puVar20);
            midi_event::copy_data
                      (this_00,data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,2,(unsigned_long)puVar20);
            device_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length = 0;
            *device_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p = '\0';
            std::__cxx11::string::
            assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((string *)
                       (device_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar21),
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + (long)puVar20));
            pcVar7 = device_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p;
            sVar8 = device_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length;
            for (sVar25 = 0; sVar8 != sVar25; sVar25 = sVar25 + 1) {
              iVar9 = tolower((int)pcVar7[sVar25]);
              pcVar7[sVar25] = (char)iVar9;
            }
          }
          else if (uVar1 == '!') {
            port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21] = this_00->m_data[2];
            device_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length = 0;
            *device_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p = '\0';
            limit_port_number<unsigned_char>
                      (this,port_numbers.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar21);
          }
          else if (uVar1 == '\t') goto LAB_001048be;
        }
        else if (0xf7 < bVar18 && puVar20 == (pointer)0x1) {
          if (device_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length != 0) {
            pbVar16 = device_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar21;
            pvVar6 = (this->m_device_names).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar17 = *(undefined8 **)
                       &pvVar6[this_00->m_channel].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
            lVar28 = (long)*(pointer *)
                            ((long)&pvVar6[this_00->m_channel].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) - (long)puVar17 >> 5;
            lVar24 = 0;
            while ((lVar26 = lVar28, lVar28 != lVar24 &&
                   (iVar9 = strcmp((char *)*puVar17,(pbVar16->_M_dataplus)._M_p), lVar26 = lVar24,
                   iVar9 != 0))) {
              lVar24 = lVar24 + 1;
              puVar17 = puVar17 + 4;
            }
            port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21] = (uchar)lVar26;
            device_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length = 0;
            *device_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p = '\0';
            limit_port_number<unsigned_char>
                      (this,port_numbers.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar21);
            bVar18 = this_00->m_data[0];
          }
          local_f8.m_event =
               (uint)bVar18 |
               (uint)port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar21] << 0x18;
          local_f8.m_timestamp = uVar11;
          std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
          emplace_back<midi_stream_event>(p_stream,&local_f8);
        }
      }
      else {
        if (device_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length != 0) {
          pbVar16 = device_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar21;
          pvVar6 = (this->m_device_names).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar17 = *(undefined8 **)
                     &pvVar6[this_00->m_channel].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data;
          lVar28 = (long)*(pointer *)
                          ((long)&pvVar6[this_00->m_channel].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) - (long)puVar17 >> 5;
          lVar24 = 0;
          while ((lVar26 = lVar28, lVar28 != lVar24 &&
                 (iVar9 = strcmp((char *)*puVar17,(pbVar16->_M_dataplus)._M_p), lVar26 = lVar24,
                 iVar9 != 0))) {
            lVar24 = lVar24 + 1;
            puVar17 = puVar17 + 4;
          }
          port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar21] = (uchar)lVar26;
          device_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length = 0;
          *device_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p = '\0';
          limit_port_number<unsigned_char>
                    (this,port_numbers.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar21);
          eVar22 = this_00->m_type;
        }
        iVar9 = (uint)this_00->m_data[0] << 8;
        if (this_00->m_data_count == 0) {
          iVar9 = 0;
        }
        iVar19 = (uint)this_00->m_data[1] << 0x10;
        if (this_00->m_data_count < 2) {
          iVar19 = 0;
        }
        local_f8.m_event =
             (uint)port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar21] * 0x1000000 +
             iVar19 + iVar9 + eVar22 * 0x10 + this_00->m_channel + 0x80;
        local_f8.m_timestamp = uVar11;
        std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
        emplace_back<midi_stream_event>(p_stream,&local_f8);
      }
    }
    else {
      uVar11 = track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      lVar24 = *(long *)&pmVar4[uVar21].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      iVar9 = *(int *)(lVar24 + 8 + uVar11 * 0x40);
      bVar18 = iVar9 == 4 & (byte)clean_flags >> 1;
      if (((clean_flags & 4) == 0) || (bVar18 != 0)) {
        if (bVar18 == 0) goto LAB_001046cc;
      }
      else if ((iVar9 != 3) || ((*(byte *)(uVar11 * 0x40 + lVar24 + 0x18) & 0xdf) != 0))
      goto LAB_001046cc;
    }
    track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar21] =
         track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar21] + 1;
  } while( true );
}

Assistant:

void midi_container::serialize_as_stream( unsigned long subsong,
                                          std::vector<midi_stream_event> & p_stream,
                                          system_exclusive_table & p_system_exclusive,
                                          unsigned long & loop_start,
                                          unsigned long & loop_end,
                                          unsigned clean_flags ) const
{
    std::vector<uint8_t> data;
    std::vector<std::size_t> track_positions;
    std::vector<uint8_t> port_numbers;
    std::vector<std::string> device_names;
    std::size_t track_count = m_tracks.size();

    unsigned long tick_loop_start = get_timestamp_loop_start(subsong);
    unsigned long tick_loop_end = get_timestamp_loop_end(subsong);
    unsigned long local_loop_start = ~0UL;
    unsigned long local_loop_end = ~0UL;

    track_positions.resize( track_count, 0 );
    port_numbers.resize( track_count, 0 );
    device_names.resize( track_count );

    bool clean_emidi = !!( clean_flags & clean_flag_emidi );
    bool clean_instruments = !!( clean_flags & clean_flag_instruments );
    bool clean_banks = !!( clean_flags & clean_flag_banks );

    if ( clean_emidi )
    {
        for ( unsigned i = 0; i < track_count; ++i )
        {
            bool skip_track = false;
            const midi_track & track = m_tracks[ i ];
            for ( unsigned j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                     event.m_data[ 0 ] == 110 )
                {
                    if ( event.m_data[ 1 ] != 0 && event.m_data[ 1 ] != 1 && event.m_data[ 1 ] != 127 )
                    {
                        skip_track = true;
                        break;
                    }
                }
            }
            if ( skip_track )
            {
                track_positions[ i ] = track.get_count();
            }
        }
    }

    if ( m_form == 2 )
    {
        for ( unsigned long i = 0; i < track_count; ++i )
        {
            if ( i != subsong ) track_positions[ i ] = m_tracks[ i ].get_count();
        }
    }

    for (;;)
    {
        unsigned long next_timestamp = ~0UL;
        std::size_t next_track = 0;
        for ( unsigned i = 0; i < track_count; ++i )
        {
            if ( track_positions[ i ] >= m_tracks[ i ].get_count() ) continue;
            if ( m_tracks[ i ][ track_positions[ i ] ].m_timestamp < next_timestamp )
            {
                next_timestamp = m_tracks[ i ][ track_positions[ i ] ].m_timestamp;
                next_track = i;
            }
        }
        if ( next_timestamp == ~0UL ) break;

        bool filtered = false;

        if ( clean_instruments || clean_banks )
        {
            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];
            if ( clean_instruments && event.m_type == midi_event::program_change ) filtered = true;
            else if ( clean_banks && event.m_type == midi_event::control_change &&
                ( event.m_data[ 0 ] == 0x00 || event.m_data[ 0 ] == 0x20 ) ) filtered = true;
        }

        if ( !filtered )
        {
            unsigned long tempo_track = 0;
            if ( m_form == 2 && subsong ) tempo_track = subsong;

            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];

            if ( local_loop_start == ~0UL && event.m_timestamp >= tick_loop_start )
                local_loop_start = p_stream.size();
            if ( local_loop_end == ~0UL && event.m_timestamp > tick_loop_end )
                local_loop_end = p_stream.size();

            unsigned long timestamp_ms = timestamp_to_ms( event.m_timestamp, tempo_track );
            if ( event.m_type != midi_event::extended )
            {
                if ( device_names[ next_track ].length() )
                {
                    unsigned long i, j;
                    for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                    {
                        if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                    }
                    port_numbers[ next_track ] = (uint8_t) i;
                    device_names[ next_track ].clear();
                    limit_port_number( port_numbers[ next_track ] );
                }

                uint32_t event_code = ( ( event.m_type + 8 ) << 4 ) + event.m_channel;
                if ( event.m_data_count >= 1 ) event_code += event.m_data[ 0 ] << 8;
                if ( event.m_data_count >= 2 ) event_code += event.m_data[ 1 ] << 16;
                event_code += port_numbers[ next_track ] << 24;
                p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
            }
            else
            {
                std::size_t data_count = event.get_data_count();
                if ( data_count >= 3 && event.m_data[ 0 ] == 0xF0 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    data.resize( data_count );
                    event.copy_data( &data[0], 0, data_count );
                    if ( data[ data_count - 1 ] == 0xF7 )
                    {
                        uint32_t system_exclusive_index = p_system_exclusive.add_entry( &data[0], data_count, port_numbers[ next_track ] );
                        p_stream.push_back( midi_stream_event( timestamp_ms, system_exclusive_index | 0x80000000 ) );
                    }
                }
                else if ( data_count >= 3 && event.m_data[ 0 ] == 0xFF )
                {
                    if ( event.m_data[ 1 ] == 4 || event.m_data[ 1 ] == 9 )
                    {
                        unsigned long _data_count = event.get_data_count() - 2;
                        data.resize( _data_count );
                        event.copy_data( &data[0], 2, _data_count );
                        device_names[ next_track ].clear();
                        device_names[ next_track ].assign( data.begin(), data.begin() + _data_count );
                        std::transform( device_names[ next_track ].begin(), device_names[ next_track ].end(), device_names[ next_track ].begin(), ::tolower );
                    }
                    else if ( event.m_data[ 1 ] == 0x21 )
                    {
                        port_numbers[ next_track ] = event.m_data[ 2 ];
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }
                }
                else if ( data_count == 1 && event.m_data[ 0 ] >= 0xF8 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    uint32_t event_code = port_numbers[ next_track ] << 24;
                    event_code += event.m_data[ 0 ];
                    p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
                }
            }
        }

        track_positions[ next_track ]++;
    }

    loop_start = local_loop_start;
    loop_end = local_loop_end;
}